

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::InitShaderCompilationThreadPool
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,
          IThreadPool *pShaderCompilationThreadPool,Uint32 NumThreads)

{
  uint uVar1;
  uint uVar2;
  RefCntAutoPtr<Diligent::IThreadPool> local_70;
  ThreadPoolCreateInfo local_68;
  
  if ((this->m_DeviceInfo).Features.AsyncShaderCompilation != DEVICE_FEATURE_STATE_DISABLED) {
    if (pShaderCompilationThreadPool != (IThreadPool *)0x0) {
      RefCntAutoPtr<Diligent::IThreadPool>::operator=
                (&this->m_pShaderCompilationThreadPool,pShaderCompilationThreadPool);
      return;
    }
    if (NumThreads != 0) {
      uVar1 = std::thread::hardware_concurrency();
      local_68.OnThreadExiting.super__Function_base._M_functor._8_8_ = 0;
      local_68.OnThreadExiting.super__Function_base._M_manager = (_Manager_type)0x0;
      local_68.OnThreadStarted._M_invoker = (_Invoker_type)0x0;
      local_68.OnThreadExiting.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_68.OnThreadStarted.super__Function_base._M_functor._8_8_ = 0;
      local_68.OnThreadStarted.super__Function_base._M_manager = (_Manager_type)0x0;
      local_68.OnThreadStarted.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_68.OnThreadExiting._M_invoker = (_Invoker_type)0x0;
      if (NumThreads == 0xffffffff) {
        uVar2 = 2;
        if (2 < uVar1) {
          uVar2 = uVar1;
        }
        local_68.NumThreads = (size_t)(uVar2 - 1);
      }
      else {
        uVar2 = (uVar1 + (uVar1 == 0)) * 4;
        uVar1 = 0x80;
        if (0x80 < uVar2) {
          uVar1 = uVar2;
        }
        local_68.NumThreads = (size_t)uVar1;
        if (NumThreads <= uVar1) {
          local_68.NumThreads = (size_t)NumThreads;
        }
      }
      CreateThreadPool((Diligent *)&local_70,&local_68);
      RefCntAutoPtr<Diligent::IThreadPool>::operator=
                (&this->m_pShaderCompilationThreadPool,&local_70);
      if (local_70.m_pObject != (IThreadPool *)0x0) {
        (*((local_70.m_pObject)->super_IObject)._vptr_IObject[2])();
        local_70.m_pObject = (IThreadPool *)0x0;
      }
      if (local_68.OnThreadExiting.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_68.OnThreadExiting.super__Function_base._M_manager)
                  ((_Any_data *)&local_68.OnThreadExiting,(_Any_data *)&local_68.OnThreadExiting,
                   __destroy_functor);
      }
      if (local_68.OnThreadStarted.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_68.OnThreadStarted.super__Function_base._M_manager)
                  ((_Any_data *)&local_68.OnThreadStarted,(_Any_data *)&local_68.OnThreadStarted,
                   __destroy_functor);
      }
    }
  }
  return;
}

Assistant:

void InitShaderCompilationThreadPool(IThreadPool* pShaderCompilationThreadPool, Uint32 NumThreads)
    {
        if (!m_DeviceInfo.Features.AsyncShaderCompilation)
            return;

        if (pShaderCompilationThreadPool != nullptr)
        {
            m_pShaderCompilationThreadPool = pShaderCompilationThreadPool;
        }
        else if (NumThreads != 0)
        {
            const Uint32 NumCores = (std::max)(std::thread::hardware_concurrency(), 1u);

            ThreadPoolCreateInfo ThreadPoolCI;
            if (NumThreads == ~0u)
            {
                // Leave one core for the main thread
                ThreadPoolCI.NumThreads = (std::max)(NumCores, 2u) - 1u;
            }
            else
            {
                ThreadPoolCI.NumThreads = (std::min)(NumThreads, (std::max)(NumCores * 4, 128u));
            }
            m_pShaderCompilationThreadPool = CreateThreadPool(ThreadPoolCI);
        }
    }